

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  uint uVar1;
  stbi_uc *psVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  long lVar7;
  stbi_uc *psVar8;
  float fVar9;
  float fVar10;
  
  if (data != (float *)0x0) {
    psVar2 = (stbi_uc *)stbi__malloc_mad3(x,y,comp,0);
    if (psVar2 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        uVar1 = ((comp & 1U) + comp) - 1;
        lVar7 = (long)comp;
        uVar5 = 0;
        pfVar6 = data;
        psVar8 = psVar2;
        do {
          uVar4 = 0;
          if (0 < (int)uVar1) {
            uVar4 = 0;
            do {
              fVar9 = powf(pfVar6[uVar4] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
              fVar10 = fVar9 * 255.0 + 0.5;
              fVar9 = 0.0;
              if (0.0 <= fVar10) {
                fVar9 = fVar10;
              }
              fVar10 = 255.0;
              if (fVar9 <= 255.0) {
                fVar10 = fVar9;
              }
              psVar8[uVar4] = (stbi_uc)(int)fVar10;
              uVar4 = uVar4 + 1;
            } while (uVar1 != uVar4);
          }
          if ((int)uVar4 < comp) {
            lVar3 = (long)(int)uVar4 + uVar5 * lVar7;
            fVar10 = data[lVar3] * 255.0 + 0.5;
            fVar9 = 0.0;
            if (0.0 <= fVar10) {
              fVar9 = fVar10;
            }
            fVar10 = 255.0;
            if (fVar9 <= 255.0) {
              fVar10 = fVar9;
            }
            psVar2[lVar3] = (stbi_uc)(int)fVar10;
          }
          uVar5 = uVar5 + 1;
          pfVar6 = pfVar6 + lVar7;
          psVar8 = psVar8 + lVar7;
        } while (uVar5 != (uint)(y * x));
      }
      free(data);
      return psVar2;
    }
    free(data);
    stbi__g_failure_reason = "outofmem";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}